

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::Federate(Federate *this,string_view fedName,FederateInfo *fedInfo)

{
  bool bVar1;
  TimeRepresentation<count_time<9,_long>_> TVar2;
  undefined8 *in_RDI;
  FederateInfo *in_stack_00000290;
  Federate *in_stack_00000298;
  undefined4 in_stack_ffffffffffffff38;
  __integral_type_conflict in_stack_ffffffffffffff3c;
  unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
  *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  allocator<char> *in_stack_ffffffffffffff70;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff78;
  FederateInfo *fedInfo_00;
  Federate *this_00;
  allocator<char> local_21 [33];
  
  *in_RDI = &PTR__Federate_00924380;
  std::atomic<helics::Federate::Modes>::atomic
            ((atomic<helics::Federate::Modes> *)(in_RDI + 1),STARTUP);
  *(undefined1 *)((long)in_RDI + 9) = 0x2f;
  *(undefined1 *)((long)in_RDI + 10) = 1;
  *(undefined1 *)((long)in_RDI + 0xb) = 0;
  *(undefined1 *)((long)in_RDI + 0xc) = 0;
  *(undefined1 *)((long)in_RDI + 0xd) = 0;
  *(undefined1 *)((long)in_RDI + 0xe) = 0;
  *(undefined1 *)((long)in_RDI + 0xf) = 0;
  LocalFederateId::LocalFederateId((LocalFederateId *)(in_RDI + 2));
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 3);
  std::shared_ptr<helics::Core>::shared_ptr((shared_ptr<helics::Core> *)0x21a13e);
  TVar2 = TimeRepresentation<count_time<9,_long>_>::minVal();
  in_RDI[5] = TVar2.internalTimeCode;
  TVar2 = TimeRepresentation<count_time<9,_long>_>::maxVal();
  in_RDI[6] = TVar2.internalTimeCode;
  std::__cxx11::string::string(in_stack_ffffffffffffff50);
  std::
  unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,std::mutex>,std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,std::mutex>>>
  ::
  unique_ptr<std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,std::mutex>>,void>
            (in_stack_ffffffffffffff40);
  fedInfo_00 = (FederateInfo *)(in_RDI + 0xc);
  std::
  unique_ptr<helics::ConnectorFederateManager,std::default_delete<helics::ConnectorFederateManager>>
  ::unique_ptr<std::default_delete<helics::ConnectorFederateManager>,void>
            ((unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
              *)in_stack_ffffffffffffff40);
  this_00 = (Federate *)(in_RDI + 0xd);
  std::
  unique_ptr<helics::PotentialInterfacesManager,std::default_delete<helics::PotentialInterfacesManager>>
  ::unique_ptr<std::default_delete<helics::PotentialInterfacesManager>,void>
            ((unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
              *)in_stack_ffffffffffffff40);
  std::atomic<int>::atomic((atomic<int> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (pbVar3,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::allocator<char>::~allocator(local_21);
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x13);
  std::
  function<void_(TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_bool)>
  ::function((function<void_(TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_bool)>
              *)pbVar3);
  std::function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)>::function
            ((function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)> *)pbVar3);
  std::function<void_(helics::Federate::Modes,_helics::Federate::Modes)>::function
            ((function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *)pbVar3);
  std::function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)>::function
            ((function<void_(TimeRepresentation<count_time<9,_long>_>,_bool)> *)pbVar3);
  std::function<void_(bool)>::function((function<void_(bool)> *)pbVar3);
  CLI::std::function<void_()>::function((function<void_()> *)pbVar3);
  CLI::std::function<void_()>::function((function<void_()> *)pbVar3);
  std::function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>)>::function
            ((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>)> *)pbVar3);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x21a2c6);
  if (bVar1) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (pbVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  }
  getCore(in_stack_00000298,in_stack_00000290);
  verifyCore(this_00);
  registerFederate(this_00,fedInfo_00);
  return;
}

Assistant:

Federate::Federate(std::string_view fedName, const FederateInfo& fedInfo): mName(fedName)
{
    if (mName.empty()) {
        mName = fedInfo.defName;
    }

    getCore(fedInfo);

    verifyCore();

    registerFederate(fedInfo);
}